

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetAttachmentParametersTest::Clean
          (GetAttachmentParametersTest *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar4;
  bool bVar5;
  long lVar3;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (this->m_fbo != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo);
    this->m_fbo = 0;
  }
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar5 = bVar1;
    if (this->m_rbo[lVar4] != 0) {
      (**(code **)(lVar3 + 0x460))(1,this->m_rbo + lVar4);
      this->m_rbo[lVar4] = 0;
    }
    lVar4 = 1;
    bVar1 = false;
  } while (bVar5);
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar5 = bVar1;
    if (this->m_to[lVar4] != 0) {
      (**(code **)(lVar3 + 0x460))(1,this->m_to + lVar4);
      this->m_to[lVar4] = 0;
    }
    lVar4 = 1;
    bVar1 = false;
  } while (bVar5);
  do {
    iVar2 = (**(code **)(lVar3 + 0x800))();
  } while (iVar2 != 0);
  return;
}

Assistant:

void GetAttachmentParametersTest::Clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Releasing obnjects. */
	if (m_fbo)
	{
		gl.deleteFramebuffers(1, &m_fbo);

		m_fbo = 0;
	}

	/* Releasing renderbuffers. */
	for (glw::GLuint i = 0; i < 2; ++i)
	{
		if (m_rbo[i])
		{
			gl.deleteRenderbuffers(1, &m_rbo[i]);

			m_rbo[i] = 0;
		}
	}

	/* Releasing textures. */
	for (glw::GLuint i = 0; i < 2; ++i)
	{
		if (m_to[i])
		{
			gl.deleteRenderbuffers(1, &m_to[i]);

			m_to[i] = 0;
		}
	}

	/* Errors clean up. */
	while (gl.getError())
		;
}